

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O0

bool __thiscall
wasm::SimplifyLocals<true,_true,_true>::runLateOptimizations
          (SimplifyLocals<true,_true,_true> *this,Function *func)

{
  __node_base_ptr p_Var1;
  PassOptions *pPVar2;
  Module *pMVar3;
  byte local_4a9;
  undefined1 local_470 [8];
  UnneededSetRemover setRemover;
  Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> local_320;
  undefined1 local_200 [8];
  EquivalentOptimizer eqOpter;
  Function *func_local;
  SimplifyLocals<true,_true,_true> *this_local;
  
  eqOpter.equivalences.indexSets._M_h._M_single_bucket = (__node_base_ptr)func;
  LocalGetCounter::analyze(&this->getCounter,func);
  runLateOptimizations::EquivalentOptimizer::EquivalentOptimizer((EquivalentOptimizer *)local_200);
  pPVar2 = Pass::getPassOptions((Pass *)this);
  PassOptions::operator=((PassOptions *)&eqOpter.removeEquivalentSets,pPVar2);
  p_Var1 = eqOpter.equivalences.indexSets._M_h._M_single_bucket;
  eqOpter.
  super_LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>.
  _216_8_ = &(this->getCounter).num;
  eqOpter.numLocalGets._0_1_ = 1;
  pMVar3 = Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
           ::getModule((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                        *)&(this->
                           super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                           ).
                           super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                      );
  Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::walkFunctionInModule
            ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)local_200,
             (Function *)p_Var1,pMVar3);
  if ((eqOpter.passOptions.passesToSkip._M_h._M_single_bucket._1_1_ & 1) != 0) {
    ReFinalize::ReFinalize((ReFinalize *)&setRemover.removed);
    p_Var1 = eqOpter.equivalences.indexSets._M_h._M_single_bucket;
    pMVar3 = Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
             ::getModule((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                          *)&(this->
                             super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                             ).
                             super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                        );
    Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walkFunctionInModule
              (&local_320,(Function *)p_Var1,pMVar3);
    ReFinalize::~ReFinalize((ReFinalize *)&setRemover.removed);
  }
  p_Var1 = eqOpter.equivalences.indexSets._M_h._M_single_bucket;
  pPVar2 = Pass::getPassOptions((Pass *)this);
  pMVar3 = Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
           ::getModule((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                        *)&(this->
                           super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                           ).
                           super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                      );
  UnneededSetRemover::UnneededSetRemover
            ((UnneededSetRemover *)local_470,&this->getCounter,(Function *)p_Var1,pPVar2,pMVar3);
  pMVar3 = Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
           ::getModule((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                        *)&(this->
                           super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                           ).
                           super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                      );
  Walker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>::setModule
            ((Walker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_> *)
             local_470,pMVar3);
  local_4a9 = 1;
  if (((byte)eqOpter.passOptions.passesToSkip._M_h._M_single_bucket & 1) == 0) {
    local_4a9 = (byte)setRemover.module;
  }
  UnneededSetRemover::~UnneededSetRemover((UnneededSetRemover *)local_470);
  runLateOptimizations::EquivalentOptimizer::~EquivalentOptimizer((EquivalentOptimizer *)local_200);
  return (bool)(local_4a9 & 1);
}

Assistant:

bool runLateOptimizations(Function* func) {
    // Finally, after optimizing a function we can do some additional
    // optimization.
    getCounter.analyze(func);
    // Remove equivalent copies - assignment of
    // a local to another local that already contains that value. Note that
    // we do that at the very end, and only after structure, as removing
    // the copy here:
    //   (if
    //    (local.get $var$0)
    //    (local.set $var$0
    //     (local.get $var$0)
    //    )
    //    (local.set $var$0
    //     (i32.const 208)
    //    )
    //   )
    // will inhibit us creating an if return value.
    struct EquivalentOptimizer
      : public LinearExecutionWalker<EquivalentOptimizer> {

      // It is ok to look at adjacent blocks together, as if a later part of a
      // block is not reached that is fine - changes we make there would not be
      // reached in that case.
      bool connectAdjacentBlocks = true;

      std::vector<Index>* numLocalGets;
      bool removeEquivalentSets;
      PassOptions passOptions;

      bool anotherCycle = false;
      bool refinalize = false;

      // We track locals containing the same value.
      EquivalentSets equivalences;

      static void doNoteNonLinear(EquivalentOptimizer* self,
                                  Expression** currp) {
        // TODO do this across non-linear paths too, in coalesce-locals perhaps?
        //      (would inhibit structure opts here, though.
        self->equivalences.clear();
      }

      void visitLocalSet(LocalSet* curr) {
        auto* module = this->getModule();

        // Remove trivial copies, even through a tee
        auto* value =
          Properties::getFallthrough(curr->value, passOptions, *module);
        if (auto* get = value->template dynCast<LocalGet>()) {
          if (equivalences.check(curr->index, get->index)) {
            // This is an unnecessary copy!
            if (removeEquivalentSets) {
              if (curr->isTee()) {
                if (curr->value->type != curr->type) {
                  refinalize = true;
                }
                this->replaceCurrent(curr->value);
              } else {
                this->replaceCurrent(Builder(*module).makeDrop(curr->value));
              }
              anotherCycle = true;
            }
            // Nothing more to do, ignore the copy.
            return;
          } else {
            // There is a new equivalence now. Remove all the old ones, and add
            // the new one.
            equivalences.reset(curr->index);
            equivalences.add(curr->index, get->index);
            return;
          }
        }
        // A new value of some kind is assigned here, and it's not something we
        // could handle earlier, so remove all the old equivalent ones.
        equivalences.reset(curr->index);
      }

      void visitLocalGet(LocalGet* curr) {
        // Canonicalize gets: if some are equivalent, then we can pick more
        // then one, and other passes may benefit from having more uniformity.
        if (auto* set = equivalences.getEquivalents(curr->index)) {
          // Helper method that returns the # of gets *ignoring the current
          // get*, as we want to see what is best overall, treating this one as
          // to be decided upon.
          auto getNumGetsIgnoringCurr = [&](Index index) {
            auto ret = (*numLocalGets)[index];
            if (index == curr->index) {
              assert(ret >= 1);
              ret--;
            }
            return ret;
          };

          // Pick the index with the most uses - maximizing the chance to
          // lower one's uses to zero. If types differ though then we prefer to
          // switch to a more refined type even if there are fewer uses, as that
          // may have significant benefits to later optimizations (we may be
          // able to use it to remove casts, etc.).
          auto* func = this->getFunction();
          Index best = -1;
          for (auto index : *set) {
            if (best == Index(-1)) {
              // This is the first possible option we've seen.
              best = index;
              continue;
            }

            auto bestType = func->getLocalType(best);
            auto addressType = func->getLocalType(index);
            if (!Type::isSubType(addressType, bestType)) {
              // This is less refined than the current best; ignore.
              continue;
            }

            // This is better if it has a more refined type, or if it has more
            // uses.
            if (addressType != bestType ||
                getNumGetsIgnoringCurr(index) > getNumGetsIgnoringCurr(best)) {
              best = index;
            }
          }
          assert(best != Index(-1));
          // Due to ordering, the best index may be different from us but have
          // the same # of locals - make sure we actually improve, either adding
          // more gets, or a more refined type (and never change to a less
          // refined type).
          auto bestType = func->getLocalType(best);
          auto oldType = func->getLocalType(curr->index);
          if (best != curr->index && Type::isSubType(bestType, oldType)) {
            auto hasMoreGets = getNumGetsIgnoringCurr(best) >
                               getNumGetsIgnoringCurr(curr->index);
            if (hasMoreGets || bestType != oldType) {
              // Update the get counts.
              (*numLocalGets)[best]++;
              assert((*numLocalGets)[curr->index] >= 1);
              (*numLocalGets)[curr->index]--;
              // Make the change.
              curr->index = best;
              anotherCycle = true;
              if (bestType != oldType) {
                curr->type = func->getLocalType(best);
                // We are switching to a more refined type, which might require
                // changes in the user of the local.get.
                refinalize = true;
              }
            }
          }
        }
      }
    };

    EquivalentOptimizer eqOpter;
    eqOpter.passOptions = this->getPassOptions();
    eqOpter.numLocalGets = &getCounter.num;
    eqOpter.removeEquivalentSets = allowStructure;
    eqOpter.walkFunctionInModule(func, this->getModule());
    if (eqOpter.refinalize) {
      ReFinalize().walkFunctionInModule(func, this->getModule());
    }

    // We may have already had a local with no uses, or we may have just
    // gotten there thanks to the EquivalentOptimizer. If there are such
    // locals, remove all their sets.
    UnneededSetRemover setRemover(
      getCounter, func, this->getPassOptions(), *this->getModule());
    setRemover.setModule(this->getModule());

    return eqOpter.anotherCycle || setRemover.removed;
  }